

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.cpp
# Opt level: O1

string * VCFrontEnd::genOutputFileName(string *__return_storage_ptr__,string *in_file,Options *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  string out_folder;
  string name;
  string folder;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  char *local_218;
  long local_210;
  char local_208 [16];
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar3 = std::__cxx11::string::rfind((char)in_file,0x2f);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,".","");
  pcVar2 = (in_file->_M_dataplus)._M_p;
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar2,pcVar2 + in_file->_M_string_length);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&local_238,(ulong)in_file);
    std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_238,(ulong)in_file);
    std::__cxx11::string::operator=((string *)&local_218,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::rfind((char)&local_218,0x2e);
  std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_218);
  std::__cxx11::string::operator=((string *)&local_218,(string *)&local_238);
  paVar1 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_1f8,local_1f8 + local_1f0);
  std::__cxx11::string::append((char *)&local_238);
  std::operator+(&local_1d8,"mkdir -p ",&local_238);
  system(local_1d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_218,local_210);
  pcVar5 = "_uni";
  if ((opts->adaptive & 1U) != 0) {
    pcVar5 = "_adp";
  }
  pcVar6 = "_ais";
  if (opts->anisotropic == false) {
    pcVar6 = pcVar5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,4);
  if (opts->quadMetric == true) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_q",2);
  }
  if (opts->validation == true) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_v",2);
  }
  if (opts->ringLevel != 2) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_r",2);
    std::ostream::operator<<(local_1a8,opts->ringLevel);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_",1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".obj",4);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string VCFrontEnd::genOutputFileName(const string& in_file, const VertexClustering::Options& opts)
{
	stringstream ss;
	size_t k = in_file.find_last_of('/');
	string folder = ".", name = in_file;
	if (k != string::npos) {
		folder = in_file.substr(0, k);
		name = in_file.substr(k + 1);
	}
	name = name.substr(0, name.find_last_of('.'));
	string out_folder = folder + "/outputs";
#if defined(_WIN32)
	CreateDirectory(out_folder.c_str(), NULL);
#else
	system(("mkdir -p " + out_folder).c_str());
#endif
	ss << out_folder << "/" << name;
	if (opts.anisotropic)    ss << "_ais";
	else if (opts.adaptive)  ss << "_adp";
	else                     ss << "_uni";
	if (opts.quadMetric)     ss << "_q";
	if (opts.validation)     ss << "_v";
	if (opts.ringLevel != 2) ss << "_r" << opts.ringLevel;
	ss << "_" << opts.numCluster << ".obj";
	return ss.str();
}